

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall
httplib::detail::from_i_to_hex_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  detail *local_18;
  size_t n_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  n_local = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    std::operator+(&local_40,"0123456789abcdef"[(uint)local_18 & 0xf],__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    local_18 = (detail *)((ulong)local_18 >> 4);
  } while (local_18 != (detail *)0x0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string from_i_to_hex(size_t n) {
  static const auto charset = "0123456789abcdef";
  std::string ret;
  do {
    ret = charset[n & 15] + ret;
    n >>= 4;
  } while (n > 0);
  return ret;
}